

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

byte * __thiscall
Js::InterpreterStackFrame::OP_ProfiledLoopStart<(Js::LayoutSize)0,true>
          (InterpreterStackFrame *this,byte *ip)

{
  code *pcVar1;
  bool bVar2;
  ImplicitCallFlags IVar3;
  OpCode OVar4;
  uint uVar5;
  OpLayoutT_Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *pOVar6;
  ScriptContext *this_00;
  FunctionBody *functionBody;
  undefined4 *puVar7;
  code *local_60;
  uint32 C2;
  OpCode peekOp;
  ThreadContext *pTStack_30;
  LayoutSize localLayoutSize;
  ThreadContext *threadContext;
  InterpreterStackFrame *pIStack_20;
  uint32 C1;
  byte *ip_local;
  InterpreterStackFrame *this_local;
  
  pIStack_20 = (InterpreterStackFrame *)ip;
  ip_local = (byte *)this;
  pOVar6 = ByteCodeReader::
           GetLayout<Js::OpLayoutT_Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>>
                     ((ByteCodeReader *)this,(byte **)&stack0xffffffffffffffe0);
  threadContext._4_4_ = (uint)pOVar6->C1;
  this_00 = GetScriptContext(this);
  pTStack_30 = ScriptContext::GetThreadContext(this_00);
  ThreadContext::IncrementLoopDepth(pTStack_30);
  functionBody = GetFunctionBody(this);
  bVar2 = DynamicProfileInfo::EnableImplicitCallFlags(functionBody);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x16b3,
                                "(Js::DynamicProfileInfo::EnableImplicitCallFlags(GetFunctionBody()))"
                                ,
                                "Js::DynamicProfileInfo::EnableImplicitCallFlags(GetFunctionBody())"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  IVar3 = ThreadContext::GetImplicitCallFlags(pTStack_30);
  *(ImplicitCallFlags *)(*(long *)(this + 0xc0) + (ulong)threadContext._4_4_) = IVar3;
  ThreadContext::SetImplicitCallFlags(pTStack_30,ImplicitCall_None);
  *(undefined4 *)(this + 0xd0) = 0;
  OVar4 = ByteCodeReader::PeekOp((ByteCodeReader *)this,(byte *)pIStack_20,&C2);
  if (OVar4 == LoopBodyStart) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x16c0,"(peekOp != OpCode::LoopBodyStart)",
                                "peekOp != OpCode::LoopBodyStart");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  if (OVar4 == ProfiledLoopBodyStart) {
    if (C2 != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                  ,0x16c3,"(localLayoutSize == layoutSize)",
                                  "localLayoutSize == layoutSize");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    uVar5 = OpCodeUtil::EncodedSize(ProfiledLoopBodyStart,SmallLayout);
    pIStack_20 = pIStack_20 + uVar5;
    pOVar6 = ByteCodeReader::
             GetLayout<Js::OpLayoutT_Unsigned1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>>
                       ((ByteCodeReader *)this,(byte **)&stack0xffffffffffffffe0);
    if (threadContext._4_4_ != pOVar6->C1) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                  ,0x16c8,"(C1 == C2)","C1 == C2");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    local_60 = *(code **)(this + 0xf8);
    if (((ulong)local_60 & 1) != 0) {
      local_60 = *(code **)(local_60 + *(long *)(this + *(long *)(this + 0x100)) + -1);
    }
    (*local_60)(this + *(long *)(this + 0x100),threadContext._4_4_,0,1);
    this_local = (InterpreterStackFrame *)ByteCodeReader::GetIP((ByteCodeReader *)this);
  }
  else {
    this_local = pIStack_20;
  }
  return (byte *)this_local;
}

Assistant:

const byte * InterpreterStackFrame::OP_ProfiledLoopStart(const byte * ip)
    {
        const uint32 C1 = m_reader.GetLayout<OpLayoutT_Unsigned1<LayoutSizePolicy<layoutSize>>>(ip)->C1;
        if (!profiled && !isAutoProfiling)
        {
            return ip;
        }

        ThreadContext *const threadContext = GetScriptContext()->GetThreadContext();
        threadContext->IncrementLoopDepth();

        // Save the implicit call flags. The interpreter may switch to profiling mode during LoopBodyStart, so always do this.
        Assert(Js::DynamicProfileInfo::EnableImplicitCallFlags(GetFunctionBody()));
        this->savedLoopImplicitCallFlags[C1] = threadContext->GetImplicitCallFlags();
        threadContext->SetImplicitCallFlags(ImplicitCall_None);

        this->currentLoopCounter = 0;

        if (!profiled)
        {
            return ip;
        }

        LayoutSize localLayoutSize;
        OpCode peekOp = m_reader.PeekOp(ip, localLayoutSize);
        Assert(peekOp != OpCode::LoopBodyStart);
        if (peekOp == OpCode::ProfiledLoopBodyStart)
        {
            Assert(localLayoutSize == layoutSize);
            ip += Js::OpCodeUtil::EncodedSize(peekOp, layoutSize);
            // We are doing JIT loop body. Process the first ProfiledLoopBodyStart to avoid recording
            // the implicit call before the first iteration
            uint32 C2 = m_reader.GetLayout<OpLayoutT_Unsigned1<LayoutSizePolicy<layoutSize>>>(ip)->C1;
            Assert(C1 == C2);
            (this->*opProfiledLoopBodyStart)(C1, layoutSize, true /* isFirstIteration */);
            return m_reader.GetIP();
        }

        return ip;
    }